

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  pointer pMVar7;
  Mat *this_00;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  void *pvVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  void *local_78;
  void *local_70;
  void *local_60;
  ulong local_50;
  void *local_48;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    uVar1 = pMVar7->w;
    iVar2 = pMVar7->h;
    lVar19 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar20 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 == 1) {
      uVar18 = iVar4 * uVar3;
      if (uVar1 == 1) {
        iVar2 = pMVar7[1].dims;
        if (iVar2 == 1) {
          Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar18) {
              fVar28 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     *(float *)((long)pvVar16 + uVar20 * 4) + fVar28;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar18) {
              fVar28 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     *(float *)((long)pvVar16 + uVar20 * 4) + fVar28;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              fVar28 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar22 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         *(float *)((long)pvVar16 + uVar24 * 4) + fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar18 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar2 = pMVar7[1].dims;
      if (iVar2 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) = *(float *)((long)pvVar16 + uVar20 * 4) + fVar28
            ;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
        }
        else {
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) =
                 *(float *)((long)pvVar21 + uVar20 * 4) + *(float *)((long)pvVar16 + uVar20 * 4);
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
        }
      }
      else {
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar4) {
              pvVar16 = pMVar7->data;
              pvVar21 = pMVar7[1].data;
              lVar19 = (long)(int)uVar3 * 4;
              lVar25 = 0;
              do {
                if (0 < (int)uVar3) {
                  fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar20 * 4) =
                         *(float *)((long)pvVar21 + uVar20 * 4) + fVar28;
                    uVar20 = uVar20 + 1;
                  } while (uVar3 != uVar20);
                }
                lVar25 = lVar25 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar19);
                pvVar21 = (void *)((long)pvVar21 + lVar19);
              } while (lVar25 != lVar26);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              pvVar16 = pMVar7->data;
              pvVar21 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar22 = 0;
              do {
                if (0 < (int)uVar18) {
                  fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         *(float *)((long)pvVar21 + uVar24 * 4) + fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar18 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      return 0;
    }
    if (iVar6 != 2) {
      if (iVar6 != 3) {
        return 0;
      }
      uVar3 = pMVar7->c;
      uVar20 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 != 1) {
        if (iVar4 == 3) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar21 + uVar24 * 4) +
                       *(float *)((long)pvVar16 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar13);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (iVar4 != 2) {
          return 0;
        }
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          lVar26 = (long)(int)uVar1 * 4;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < iVar2) {
              lVar25 = 0;
              pvVar17 = pvVar16;
              pvVar23 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar21 + lVar25 * 4 + uVar22 * lVar19 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar23 + uVar24 * 4) =
                         *(float *)((long)pvVar17 + uVar24 * 4) + fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar1 != uVar24);
                }
                lVar25 = lVar25 + 1;
                pvVar23 = (void *)((long)pvVar23 + lVar26);
                pvVar17 = (void *)((long)pvVar17 + lVar26);
              } while (lVar25 != lVar19);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              fVar28 = *(float *)((long)pvVar21 + uVar22 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     *(float *)((long)pvVar16 + uVar24 * 4) + fVar28;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar3) {
        fVar28 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar22 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar24 = 0;
            do {
              *(float *)((long)pvVar15 + uVar24 * 4) =
                   *(float *)((long)pvVar16 + uVar24 * 4) + fVar28;
              uVar24 = uVar24 + 1;
            } while (uVar14 != uVar24);
          }
          uVar22 = uVar22 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
        } while (uVar22 != uVar20);
        return 0;
      }
      return 0;
    }
    if (pMVar7[1].dims == 3) {
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 != 0) {
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          lVar19 = (long)(int)uVar3 * 4;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < iVar4) {
              lVar25 = 0;
              pvVar17 = pvVar15;
              pvVar23 = pvVar21;
              do {
                if (0 < (int)uVar3) {
                  fVar28 = *(float *)((long)pvVar16 + lVar25 * 4 + uVar22 * lVar26 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar17 + uVar24 * 4) =
                         *(float *)((long)pvVar23 + uVar24 * 4) + fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar3 != uVar24);
                }
                lVar25 = lVar25 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar19);
                pvVar23 = (void *)((long)pvVar23 + lVar19);
              } while (lVar25 != lVar26);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].dims != 1) {
      if (pMVar7[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar20 = 0;
        do {
          *(float *)((long)pvVar15 + uVar20 * 4) =
               *(float *)((long)pvVar21 + uVar20 * 4) + *(float *)((long)pvVar16 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (pMVar7[1].w != 1) {
        if (0 < iVar2) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar26 = (long)(int)uVar1 * 4;
          lVar25 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     *(float *)((long)pvVar16 + uVar20 * 4) + fVar28;
                uVar20 = uVar20 + 1;
              } while (uVar1 != uVar20);
            }
            lVar25 = lVar25 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar26);
            pvVar16 = (void *)((long)pvVar16 + lVar26);
          } while (lVar25 != lVar19);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar14) {
        fVar28 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        uVar20 = 0;
        do {
          *(float *)((long)pvVar15 + uVar20 * 4) = *(float *)((long)pvVar16 + uVar20 * 4) + fVar28;
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    return -100;
  case 2:
    uVar1 = pMVar7->w;
    iVar2 = pMVar7->h;
    lVar19 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar20 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        uVar3 = pMVar7->c;
        uVar20 = (ulong)uVar3;
        Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar4 = pMVar7[1].dims;
        if (iVar4 != 1) {
          if (iVar4 == 3) {
            if (0 < (int)uVar3) {
              pvVar16 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar21 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              sVar12 = pMVar7[1].cstep;
              sVar13 = pMVar7->cstep;
              uVar22 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         *(float *)((long)pvVar21 + uVar24 * 4) *
                         *(float *)((long)pvVar16 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
                pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar13);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          if (iVar4 != 2) {
            return 0;
          }
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            lVar26 = (long)(int)uVar1 * 4;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < iVar2) {
                lVar25 = 0;
                pvVar17 = pvVar16;
                pvVar23 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar21 + lVar25 * 4 + uVar22 * lVar19 * 4);
                    uVar24 = 0;
                    do {
                      *(float *)((long)pvVar23 + uVar24 * 4) =
                           *(float *)((long)pvVar17 + uVar24 * 4) * fVar28;
                      uVar24 = uVar24 + 1;
                    } while (uVar1 != uVar24);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar23 = (void *)((long)pvVar23 + lVar26);
                  pvVar17 = (void *)((long)pvVar17 + lVar26);
                } while (lVar25 != lVar19);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar28 = *(float *)((long)pvVar21 + uVar22 * 4);
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar16 + uVar24 * 4) * fVar28;
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     *(float *)((long)pvVar16 + uVar24 * 4) * fVar28;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            lVar19 = (long)(int)uVar3 * 4;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < iVar4) {
                lVar25 = 0;
                pvVar17 = pvVar15;
                pvVar23 = pvVar21;
                do {
                  if (0 < (int)uVar3) {
                    fVar28 = *(float *)((long)pvVar16 + lVar25 * 4 + uVar22 * lVar26 * 4);
                    uVar24 = 0;
                    do {
                      *(float *)((long)pvVar17 + uVar24 * 4) =
                           *(float *)((long)pvVar23 + uVar24 * 4) * fVar28;
                      uVar24 = uVar24 + 1;
                    } while (uVar3 != uVar24);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar17 = (void *)((long)pvVar17 + lVar19);
                  pvVar23 = (void *)((long)pvVar23 + lVar19);
                } while (lVar25 != lVar26);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) =
                 *(float *)((long)pvVar21 + uVar20 * 4) * *(float *)((long)pvVar16 + uVar20 * 4);
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar26 = (long)(int)uVar1 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar20 * 4) =
                       *(float *)((long)pvVar16 + uVar20 * 4) * fVar28;
                  uVar20 = uVar20 + 1;
                } while (uVar1 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar26);
              pvVar16 = (void *)((long)pvVar16 + lVar26);
            } while (lVar25 != lVar19);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) = *(float *)((long)pvVar16 + uVar20 * 4) * fVar28
            ;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar18 = iVar4 * uVar3;
    if (uVar1 == 1) {
      iVar2 = pMVar7[1].dims;
      if (iVar2 == 1) {
        Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   *(float *)((long)pvVar16 + uVar20 * 4) * fVar28;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   *(float *)((long)pvVar16 + uVar20 * 4) * fVar28;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar16 + uVar24 * 4) * fVar28;
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    iVar2 = pMVar7[1].dims;
    if (iVar2 != 1) {
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar19 = (long)(int)uVar3 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar20 * 4) =
                       *(float *)((long)pvVar21 + uVar20 * 4) * fVar28;
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar19);
              pvVar21 = (void *)((long)pvVar21 + lVar19);
            } while (lVar25 != lVar26);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar18) {
              fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     *(float *)((long)pvVar21 + uVar24 * 4) * fVar28;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar20 = 0;
        do {
          *(float *)((long)pvVar15 + uVar20 * 4) =
               *(float *)((long)pvVar21 + uVar20 * 4) * *(float *)((long)pvVar16 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar14) {
      fVar28 = *pMVar7[1].data;
      pvVar16 = pMVar7->data;
      uVar20 = 0;
      do {
        *(float *)((long)pvVar15 + uVar20 * 4) = *(float *)((long)pvVar16 + uVar20 * 4) * fVar28;
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
      return 0;
    }
    return 0;
  case 3:
    uVar1 = pMVar7->w;
    iVar2 = pMVar7->h;
    lVar19 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar20 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        uVar3 = pMVar7->c;
        uVar20 = (ulong)uVar3;
        Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar4 = pMVar7[1].dims;
        if (iVar4 != 1) {
          if (iVar4 == 3) {
            if (0 < (int)uVar3) {
              pvVar16 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar21 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              sVar12 = pMVar7[1].cstep;
              sVar13 = pMVar7->cstep;
              uVar22 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         *(float *)((long)pvVar16 + uVar24 * 4) /
                         *(float *)((long)pvVar21 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
                pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar13);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          if (iVar4 != 2) {
            return 0;
          }
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            lVar26 = (long)(int)uVar1 * 4;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < iVar2) {
                lVar25 = 0;
                pvVar17 = pvVar15;
                pvVar23 = pvVar16;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar21 + lVar25 * 4 + uVar22 * lVar19 * 4);
                    uVar24 = 0;
                    do {
                      *(float *)((long)pvVar17 + uVar24 * 4) =
                           *(float *)((long)pvVar23 + uVar24 * 4) * (1.0 / fVar28);
                      uVar24 = uVar24 + 1;
                    } while (uVar1 != uVar24);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar17 = (void *)((long)pvVar17 + lVar26);
                  pvVar23 = (void *)((long)pvVar23 + lVar26);
                } while (lVar25 != lVar19);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar28 = *(float *)((long)pvVar21 + uVar22 * 4);
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar16 + uVar24 * 4) * (1.0 / fVar28);
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar7->elemsize;
          fVar28 = *pMVar7[1].data;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     *(float *)((long)pvVar16 + uVar24 * 4) * (1.0 / fVar28);
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar16 = (void *)((long)pvVar16 + sVar10 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            lVar19 = (long)(int)uVar3 * 4;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < iVar4) {
                lVar25 = 0;
                pvVar17 = pvVar21;
                pvVar23 = pvVar15;
                do {
                  if (0 < (int)uVar3) {
                    fVar28 = *(float *)((long)pvVar16 + lVar25 * 4 + uVar22 * lVar26 * 4);
                    uVar24 = 0;
                    do {
                      *(float *)((long)pvVar23 + uVar24 * 4) =
                           fVar28 / *(float *)((long)pvVar17 + uVar24 * 4);
                      uVar24 = uVar24 + 1;
                    } while (uVar3 != uVar24);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar23 = (void *)((long)pvVar23 + lVar19);
                  pvVar17 = (void *)((long)pvVar17 + lVar19);
                } while (lVar25 != lVar26);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) =
                 *(float *)((long)pvVar16 + uVar20 * 4) / *(float *)((long)pvVar21 + uVar20 * 4);
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar26 = (long)(int)uVar1 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar20 * 4) =
                       *(float *)((long)pvVar16 + uVar20 * 4) * (1.0 / fVar28);
                  uVar20 = uVar20 + 1;
                } while (uVar1 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar26);
              pvVar16 = (void *)((long)pvVar16 + lVar26);
            } while (lVar25 != lVar19);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          fVar28 = *pMVar7[1].data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) =
                 *(float *)((long)pvVar16 + uVar20 * 4) * (1.0 / fVar28);
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar18 = iVar4 * uVar3;
    if (uVar1 == 1) {
      iVar2 = pMVar7[1].dims;
      if (iVar2 == 1) {
        Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   fVar28 / *(float *)((long)pvVar16 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   fVar28 / *(float *)((long)pvVar16 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       fVar28 / *(float *)((long)pvVar16 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    iVar2 = pMVar7[1].dims;
    if (iVar2 != 1) {
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar19 = (long)(int)uVar3 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar20 * 4) =
                       fVar28 / *(float *)((long)pvVar21 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar19);
              pvVar21 = (void *)((long)pvVar21 + lVar19);
            } while (lVar25 != lVar26);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar18) {
              fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     fVar28 / *(float *)((long)pvVar21 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar20 = 0;
        do {
          *(float *)((long)pvVar15 + uVar20 * 4) =
               *(float *)((long)pvVar16 + uVar20 * 4) / *(float *)((long)pvVar21 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar14) {
      pvVar16 = pMVar7->data;
      fVar28 = *pMVar7[1].data;
      uVar20 = 0;
      do {
        *(float *)((long)pvVar15 + uVar20 * 4) =
             *(float *)((long)pvVar16 + uVar20 * 4) * (1.0 / fVar28);
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
      return 0;
    }
    return 0;
  case 4:
    uVar1 = pMVar7->w;
    iVar2 = pMVar7->h;
    lVar19 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar20 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        uVar3 = pMVar7->c;
        uVar20 = (ulong)uVar3;
        Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar4 = pMVar7[1].dims;
        if (iVar4 != 1) {
          if (iVar4 == 3) {
            if (0 < (int)uVar3) {
              pvVar16 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar21 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              sVar12 = pMVar7[1].cstep;
              sVar13 = pMVar7->cstep;
              uVar22 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar24 = 0;
                  do {
                    fVar28 = *(float *)((long)pvVar21 + uVar24 * 4);
                    fVar27 = *(float *)((long)pvVar16 + uVar24 * 4);
                    if (fVar28 <= fVar27) {
                      fVar28 = fVar27;
                    }
                    *(float *)((long)pvVar15 + uVar24 * 4) = fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
                pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar13);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          if (iVar4 != 2) {
            return 0;
          }
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            lVar26 = (long)(int)uVar1 * 4;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < iVar2) {
                lVar25 = 0;
                pvVar17 = pvVar16;
                pvVar23 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar21 + lVar25 * 4 + uVar22 * lVar19 * 4);
                    uVar24 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar17 + uVar24 * 4);
                      if (fVar27 <= fVar28) {
                        fVar27 = fVar28;
                      }
                      *(float *)((long)pvVar23 + uVar24 * 4) = fVar27;
                      uVar24 = uVar24 + 1;
                    } while (uVar1 != uVar24);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar23 = (void *)((long)pvVar23 + lVar26);
                  pvVar17 = (void *)((long)pvVar17 + lVar26);
                } while (lVar25 != lVar19);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar28 = *(float *)((long)pvVar21 + uVar22 * 4);
                uVar24 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar16 + uVar24 * 4);
                  if (fVar27 <= fVar28) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                fVar27 = *(float *)((long)pvVar16 + uVar24 * 4);
                if (fVar27 <= fVar28) {
                  fVar27 = fVar28;
                }
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            lVar19 = (long)(int)uVar3 * 4;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < iVar4) {
                lVar25 = 0;
                pvVar17 = pvVar15;
                pvVar23 = pvVar21;
                do {
                  if (0 < (int)uVar3) {
                    fVar28 = *(float *)((long)pvVar16 + lVar25 * 4 + uVar22 * lVar26 * 4);
                    uVar24 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar23 + uVar24 * 4);
                      if (fVar27 <= fVar28) {
                        fVar27 = fVar28;
                      }
                      *(float *)((long)pvVar17 + uVar24 * 4) = fVar27;
                      uVar24 = uVar24 + 1;
                    } while (uVar3 != uVar24);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar17 = (void *)((long)pvVar17 + lVar19);
                  pvVar23 = (void *)((long)pvVar23 + lVar19);
                } while (lVar25 != lVar26);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar20 = 0;
          do {
            fVar28 = *(float *)((long)pvVar21 + uVar20 * 4);
            fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
            if (fVar28 <= fVar27) {
              fVar28 = fVar27;
            }
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar28;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar26 = (long)(int)uVar1 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
                uVar20 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
                  if (fVar27 <= fVar28) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
                  uVar20 = uVar20 + 1;
                } while (uVar1 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar26);
              pvVar16 = (void *)((long)pvVar16 + lVar26);
            } while (lVar25 != lVar19);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar20 = 0;
          do {
            fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
            if (fVar27 <= fVar28) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar18 = iVar4 * uVar3;
    if (uVar1 == 1) {
      iVar2 = pMVar7[1].dims;
      if (iVar2 == 1) {
        Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
              if (fVar27 <= fVar28) {
                fVar27 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
              if (fVar27 <= fVar28) {
                fVar27 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar24 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar16 + uVar24 * 4);
                  if (fVar27 <= fVar28) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    iVar2 = pMVar7[1].dims;
    if (iVar2 != 1) {
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar19 = (long)(int)uVar3 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
                uVar20 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar21 + uVar20 * 4);
                  if (fVar27 <= fVar28) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar19);
              pvVar21 = (void *)((long)pvVar21 + lVar19);
            } while (lVar25 != lVar26);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar18) {
              fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
              uVar24 = 0;
              do {
                fVar27 = *(float *)((long)pvVar21 + uVar24 * 4);
                if (fVar27 <= fVar28) {
                  fVar27 = fVar28;
                }
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar20 = 0;
        do {
          fVar28 = *(float *)((long)pvVar21 + uVar20 * 4);
          fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
          if (fVar28 <= fVar27) {
            fVar28 = fVar27;
          }
          *(float *)((long)pvVar15 + uVar20 * 4) = fVar28;
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar14) {
      fVar28 = *pMVar7[1].data;
      pvVar16 = pMVar7->data;
      uVar20 = 0;
      do {
        fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
        if (fVar27 <= fVar28) {
          fVar27 = fVar28;
        }
        *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
      return 0;
    }
    return 0;
  case 5:
    uVar1 = pMVar7->w;
    iVar2 = pMVar7->h;
    lVar19 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar20 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        uVar3 = pMVar7->c;
        uVar20 = (ulong)uVar3;
        Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar4 = pMVar7[1].dims;
        if (iVar4 != 1) {
          if (iVar4 == 3) {
            if (0 < (int)uVar3) {
              pvVar16 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar21 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              sVar12 = pMVar7[1].cstep;
              sVar13 = pMVar7->cstep;
              uVar22 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar24 = 0;
                  do {
                    fVar28 = *(float *)((long)pvVar21 + uVar24 * 4);
                    fVar27 = *(float *)((long)pvVar16 + uVar24 * 4);
                    if (fVar27 <= fVar28) {
                      fVar28 = fVar27;
                    }
                    *(float *)((long)pvVar15 + uVar24 * 4) = fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
                pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar13);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          if (iVar4 != 2) {
            return 0;
          }
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            lVar26 = (long)(int)uVar1 * 4;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < iVar2) {
                lVar25 = 0;
                pvVar17 = pvVar16;
                pvVar23 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar21 + lVar25 * 4 + uVar22 * lVar19 * 4);
                    uVar24 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar17 + uVar24 * 4);
                      if (fVar28 <= fVar27) {
                        fVar27 = fVar28;
                      }
                      *(float *)((long)pvVar23 + uVar24 * 4) = fVar27;
                      uVar24 = uVar24 + 1;
                    } while (uVar1 != uVar24);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar23 = (void *)((long)pvVar23 + lVar26);
                  pvVar17 = (void *)((long)pvVar17 + lVar26);
                } while (lVar25 != lVar19);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar28 = *(float *)((long)pvVar21 + uVar22 * 4);
                uVar24 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar16 + uVar24 * 4);
                  if (fVar28 <= fVar27) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                fVar27 = *(float *)((long)pvVar16 + uVar24 * 4);
                if (fVar28 <= fVar27) {
                  fVar27 = fVar28;
                }
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            lVar19 = (long)(int)uVar3 * 4;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < iVar4) {
                lVar25 = 0;
                pvVar17 = pvVar15;
                pvVar23 = pvVar21;
                do {
                  if (0 < (int)uVar3) {
                    fVar28 = *(float *)((long)pvVar16 + lVar25 * 4 + uVar22 * lVar26 * 4);
                    uVar24 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar23 + uVar24 * 4);
                      if (fVar28 <= fVar27) {
                        fVar27 = fVar28;
                      }
                      *(float *)((long)pvVar17 + uVar24 * 4) = fVar27;
                      uVar24 = uVar24 + 1;
                    } while (uVar3 != uVar24);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar17 = (void *)((long)pvVar17 + lVar19);
                  pvVar23 = (void *)((long)pvVar23 + lVar19);
                } while (lVar25 != lVar26);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar20 = 0;
          do {
            fVar28 = *(float *)((long)pvVar21 + uVar20 * 4);
            fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
            if (fVar27 <= fVar28) {
              fVar28 = fVar27;
            }
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar28;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar26 = (long)(int)uVar1 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
                uVar20 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
                  if (fVar28 <= fVar27) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
                  uVar20 = uVar20 + 1;
                } while (uVar1 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar26);
              pvVar16 = (void *)((long)pvVar16 + lVar26);
            } while (lVar25 != lVar19);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar20 = 0;
          do {
            fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
            if (fVar28 <= fVar27) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar18 = iVar4 * uVar3;
    if (uVar1 == 1) {
      iVar2 = pMVar7[1].dims;
      if (iVar2 == 1) {
        Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
              if (fVar28 <= fVar27) {
                fVar27 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
              if (fVar28 <= fVar27) {
                fVar27 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar24 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar16 + uVar24 * 4);
                  if (fVar28 <= fVar27) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    iVar2 = pMVar7[1].dims;
    if (iVar2 != 1) {
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar19 = (long)(int)uVar3 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
                uVar20 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar21 + uVar20 * 4);
                  if (fVar28 <= fVar27) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar19);
              pvVar21 = (void *)((long)pvVar21 + lVar19);
            } while (lVar25 != lVar26);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar18) {
              fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
              uVar24 = 0;
              do {
                fVar27 = *(float *)((long)pvVar21 + uVar24 * 4);
                if (fVar28 <= fVar27) {
                  fVar27 = fVar28;
                }
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar20 = 0;
        do {
          fVar28 = *(float *)((long)pvVar21 + uVar20 * 4);
          fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
          if (fVar27 <= fVar28) {
            fVar28 = fVar27;
          }
          *(float *)((long)pvVar15 + uVar20 * 4) = fVar28;
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar14) {
      fVar28 = *pMVar7[1].data;
      pvVar16 = pMVar7->data;
      uVar20 = 0;
      do {
        fVar27 = *(float *)((long)pvVar16 + uVar20 * 4);
        if (fVar28 <= fVar27) {
          fVar27 = fVar28;
        }
        *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
      return 0;
    }
    return 0;
  case 6:
    uVar1 = pMVar7->w;
    iVar2 = pMVar7->h;
    lVar26 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    iVar4 = pMVar7[1].h;
    lVar19 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar20 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        uVar3 = pMVar7->c;
        uVar20 = (ulong)uVar3;
        Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
        local_78 = this_00->data;
        if (local_78 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar4 = pMVar7[1].dims;
        if (iVar4 != 1) {
          if (iVar4 == 3) {
            if (0 < (int)uVar3) {
              pvVar15 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar16 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              sVar12 = pMVar7[1].cstep;
              sVar13 = pMVar7->cstep;
              uVar22 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar24 = 0;
                  do {
                    fVar28 = powf(*(float *)((long)pvVar15 + uVar24 * 4),
                                  *(float *)((long)pvVar16 + uVar24 * 4));
                    *(float *)((long)local_78 + uVar24 * 4) = fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar14 != uVar24);
                }
                uVar22 = uVar22 + 1;
                local_78 = (void *)((long)local_78 + sVar8 * sVar11);
                pvVar16 = (void *)((long)pvVar16 + sVar10 * sVar12);
                pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar13);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          if (iVar4 != 2) {
            return 0;
          }
          if (0 < (int)uVar3) {
            local_48 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar15 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            lVar19 = (long)(int)uVar1 * 4;
            sVar11 = pMVar7->cstep;
            local_70 = (void *)0x0;
            do {
              if (0 < iVar2) {
                lVar25 = 0;
                pvVar16 = local_78;
                pvVar21 = local_48;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar15 + lVar25 * 4 + (long)local_70 * lVar26 * 4);
                    uVar22 = 0;
                    do {
                      fVar27 = powf(*(float *)((long)pvVar21 + uVar22 * 4),fVar28);
                      *(float *)((long)pvVar16 + uVar22 * 4) = fVar27;
                      uVar22 = uVar22 + 1;
                    } while (uVar1 != uVar22);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar16 = (void *)((long)pvVar16 + lVar19);
                  pvVar21 = (void *)((long)pvVar21 + lVar19);
                } while (lVar25 != lVar26);
              }
              local_70 = (void *)((long)local_70 + 1);
              local_78 = (void *)((long)local_78 + sVar8 * sVar10);
              local_48 = (void *)((long)local_48 + sVar9 * sVar11);
            } while (local_70 != (void *)uVar20);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar3) {
            pvVar15 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar16 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
                uVar24 = 0;
                do {
                  fVar27 = powf(*(float *)((long)pvVar15 + uVar24 * 4),fVar28);
                  *(float *)((long)local_78 + uVar24 * 4) = fVar27;
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              local_78 = (void *)((long)local_78 + sVar8 * sVar10);
              pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar3) {
          fVar28 = *pMVar7[1].data;
          pvVar15 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                fVar27 = powf(*(float *)((long)pvVar15 + uVar24 * 4),fVar28);
                *(float *)((long)local_78 + uVar24 * 4) = fVar27;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            local_78 = (void *)((long)local_78 + sVar8 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        local_70 = this_00->data;
        if (local_70 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar15 = pMVar7->data;
            local_60 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            lVar26 = (long)(int)uVar3 * 4;
            sVar11 = pMVar7[1].cstep;
            local_50 = 0;
            do {
              if (0 < iVar4) {
                lVar25 = 0;
                pvVar16 = local_70;
                pvVar21 = local_60;
                do {
                  if (0 < (int)uVar3) {
                    fVar28 = *(float *)((long)pvVar15 + lVar25 * 4 + local_50 * lVar19 * 4);
                    uVar22 = 0;
                    do {
                      fVar27 = powf(fVar28,*(float *)((long)pvVar21 + uVar22 * 4));
                      *(float *)((long)pvVar16 + uVar22 * 4) = fVar27;
                      uVar22 = uVar22 + 1;
                    } while (uVar3 != uVar22);
                  }
                  lVar25 = lVar25 + 1;
                  pvVar16 = (void *)((long)pvVar16 + lVar26);
                  pvVar21 = (void *)((long)pvVar21 + lVar26);
                } while (lVar25 != lVar19);
              }
              local_50 = local_50 + 1;
              local_70 = (void *)((long)local_70 + sVar8 * sVar10);
              local_60 = (void *)((long)local_60 + sVar9 * sVar11);
            } while (local_50 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar20 = 0;
          do {
            fVar28 = powf(*(float *)((long)pvVar16 + uVar20 * 4),
                          *(float *)((long)pvVar21 + uVar20 * 4));
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar28;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar19 = (long)(int)uVar1 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
                uVar20 = 0;
                do {
                  fVar27 = powf(*(float *)((long)pvVar16 + uVar20 * 4),fVar28);
                  *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
                  uVar20 = uVar20 + 1;
                } while (uVar1 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar19);
              pvVar16 = (void *)((long)pvVar16 + lVar19);
            } while (lVar25 != lVar26);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar20 = 0;
          do {
            fVar27 = powf(*(float *)((long)pvVar16 + uVar20 * 4),fVar28);
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar18 = iVar4 * uVar3;
    if (uVar1 == 1) {
      iVar2 = pMVar7[1].dims;
      if (iVar2 == 1) {
        Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              fVar27 = powf(fVar28,*(float *)((long)pvVar16 + uVar20 * 4));
              *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            uVar20 = 0;
            do {
              fVar27 = powf(fVar28,*(float *)((long)pvVar16 + uVar20 * 4));
              *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            fVar28 = *pMVar7->data;
            pvVar16 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar24 = 0;
                do {
                  fVar27 = powf(fVar28,*(float *)((long)pvVar16 + uVar24 * 4));
                  *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    iVar2 = pMVar7[1].dims;
    if (iVar2 != 1) {
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar26 = (long)(int)uVar3 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
                uVar20 = 0;
                do {
                  fVar27 = powf(fVar28,*(float *)((long)pvVar21 + uVar20 * 4));
                  *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar26);
              pvVar21 = (void *)((long)pvVar21 + lVar26);
            } while (lVar25 != lVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar18) {
              fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
              uVar24 = 0;
              do {
                fVar27 = powf(fVar28,*(float *)((long)pvVar21 + uVar24 * 4));
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar20 = 0;
        do {
          fVar28 = powf(*(float *)((long)pvVar16 + uVar20 * 4),
                        *(float *)((long)pvVar21 + uVar20 * 4));
          *(float *)((long)pvVar15 + uVar20 * 4) = fVar28;
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar14) {
      fVar28 = *pMVar7[1].data;
      pvVar16 = pMVar7->data;
      uVar20 = 0;
      do {
        fVar27 = powf(*(float *)((long)pvVar16 + uVar20 * 4),fVar28);
        *(float *)((long)pvVar15 + uVar20 * 4) = fVar27;
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
      return 0;
    }
    return 0;
  case 7:
    uVar1 = pMVar7->w;
    iVar2 = pMVar7->h;
    lVar19 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar20 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 == 1) {
      uVar18 = iVar4 * uVar3;
      if (uVar1 == 1) {
        iVar2 = pMVar7[1].dims;
        if (iVar2 == 1) {
          Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar18) {
              fVar28 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     *(float *)((long)pvVar16 + uVar20 * 4) - fVar28;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 2) {
          Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar18) {
              fVar28 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     *(float *)((long)pvVar16 + uVar20 * 4) - fVar28;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar2 == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              fVar28 = *pMVar7->data;
              pvVar16 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar22 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         *(float *)((long)pvVar16 + uVar24 * 4) - fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar18 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      iVar2 = pMVar7[1].dims;
      if (iVar2 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w == 1) {
            if (0 < (int)uVar14) {
              fVar28 = *pMVar7[1].data;
              pvVar16 = pMVar7->data;
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     fVar28 - *(float *)((long)pvVar16 + uVar20 * 4);
                uVar20 = uVar20 + 1;
              } while (uVar14 != uVar20);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar14) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   *(float *)((long)pvVar21 + uVar20 * 4) - *(float *)((long)pvVar16 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
            return 0;
          }
          return 0;
        }
      }
      else if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar19 = (long)(int)uVar3 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar20 * 4) =
                       *(float *)((long)pvVar21 + uVar20 * 4) - fVar28;
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar19);
              pvVar21 = (void *)((long)pvVar21 + lVar19);
            } while (lVar25 != lVar26);
            return 0;
          }
          return 0;
        }
      }
      else {
        if (iVar2 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar18) {
                fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar21 + uVar24 * 4) - fVar28;
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
      }
      return -100;
    }
    if (iVar6 != 2) {
      if (iVar6 != 3) {
        return 0;
      }
      uVar3 = pMVar7->c;
      uVar20 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 != 1) {
        if (iVar4 == 3) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar21 + uVar24 * 4) -
                       *(float *)((long)pvVar16 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar13);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (iVar4 != 2) {
          return 0;
        }
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          lVar26 = (long)(int)uVar1 * 4;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < iVar2) {
              lVar25 = 0;
              pvVar17 = pvVar16;
              pvVar23 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar21 + lVar25 * 4 + uVar22 * lVar19 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar23 + uVar24 * 4) =
                         fVar28 - *(float *)((long)pvVar17 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar1 != uVar24);
                }
                lVar25 = lVar25 + 1;
                pvVar23 = (void *)((long)pvVar23 + lVar26);
                pvVar17 = (void *)((long)pvVar17 + lVar26);
              } while (lVar25 != lVar19);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              fVar28 = *(float *)((long)pvVar21 + uVar22 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     fVar28 - *(float *)((long)pvVar16 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar3) {
        fVar28 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar22 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar24 = 0;
            do {
              *(float *)((long)pvVar15 + uVar24 * 4) =
                   fVar28 - *(float *)((long)pvVar16 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar14 != uVar24);
          }
          uVar22 = uVar22 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
        } while (uVar22 != uVar20);
        return 0;
      }
      return 0;
    }
    if (pMVar7[1].dims == 3) {
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 != 0) {
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          lVar19 = (long)(int)uVar3 * 4;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < iVar4) {
              lVar25 = 0;
              pvVar17 = pvVar15;
              pvVar23 = pvVar21;
              do {
                if (0 < (int)uVar3) {
                  fVar28 = *(float *)((long)pvVar16 + lVar25 * 4 + uVar22 * lVar26 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar17 + uVar24 * 4) =
                         *(float *)((long)pvVar23 + uVar24 * 4) - fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar3 != uVar24);
                }
                lVar25 = lVar25 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar19);
                pvVar23 = (void *)((long)pvVar23 + lVar19);
              } while (lVar25 != lVar26);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) =
                 *(float *)((long)pvVar21 + uVar20 * 4) - *(float *)((long)pvVar16 + uVar20 * 4);
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < iVar2) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar26 = (long)(int)uVar1 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar20 * 4) =
                       fVar28 - *(float *)((long)pvVar16 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar1 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar26);
              pvVar16 = (void *)((long)pvVar16 + lVar26);
            } while (lVar25 != lVar19);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar28 = *pMVar7[1].data;
          pvVar16 = pMVar7->data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar28 - *(float *)((long)pvVar16 + uVar20 * 4)
            ;
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    return -100;
  case 8:
    uVar1 = pMVar7->w;
    iVar2 = pMVar7->h;
    lVar19 = (long)iVar2;
    uVar14 = iVar2 * uVar1;
    sVar8 = pMVar7->elemsize;
    uVar3 = pMVar7[1].w;
    iVar4 = pMVar7[1].h;
    lVar26 = (long)iVar4;
    uVar5 = pMVar7[1].c;
    uVar20 = (ulong)uVar5;
    iVar6 = pMVar7->dims;
    if (iVar6 != 1) {
      if (iVar6 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar5) {
              pvVar16 = pMVar7->data;
              pvVar21 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              lVar19 = (long)(int)uVar3 * 4;
              sVar11 = pMVar7[1].cstep;
              uVar22 = 0;
              do {
                if (0 < iVar4) {
                  lVar25 = 0;
                  pvVar17 = pvVar21;
                  pvVar23 = pvVar15;
                  do {
                    if (0 < (int)uVar3) {
                      fVar28 = *(float *)((long)pvVar16 + lVar25 * 4 + uVar22 * lVar26 * 4);
                      uVar24 = 0;
                      do {
                        *(float *)((long)pvVar23 + uVar24 * 4) =
                             *(float *)((long)pvVar17 + uVar24 * 4) * (1.0 / fVar28);
                        uVar24 = uVar24 + 1;
                      } while (uVar3 != uVar24);
                    }
                    lVar25 = lVar25 + 1;
                    pvVar23 = (void *)((long)pvVar23 + lVar19);
                    pvVar17 = (void *)((long)pvVar17 + lVar19);
                  } while (lVar25 != lVar26);
                }
                uVar22 = uVar22 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
              } while (uVar22 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims == 1) {
          Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w != 1) {
            if (0 < iVar2) {
              pvVar16 = pMVar7->data;
              pvVar21 = pMVar7[1].data;
              lVar26 = (long)(int)uVar1 * 4;
              lVar25 = 0;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar20 * 4) =
                         fVar28 / *(float *)((long)pvVar16 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar1 != uVar20);
                }
                lVar25 = lVar25 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar26);
                pvVar16 = (void *)((long)pvVar16 + lVar26);
              } while (lVar25 != lVar19);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar14) {
            fVar28 = *pMVar7[1].data;
            pvVar16 = pMVar7->data;
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   fVar28 / *(float *)((long)pvVar16 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) =
                 *(float *)((long)pvVar21 + uVar20 * 4) / *(float *)((long)pvVar16 + uVar20 * 4);
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
          return 0;
        }
        return 0;
      }
      if (iVar6 != 3) {
        return 0;
      }
      uVar3 = pMVar7->c;
      uVar20 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 != 1) {
        if (iVar4 == 3) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar21 + uVar24 * 4) /
                       *(float *)((long)pvVar16 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar13);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (iVar4 != 2) {
          return 0;
        }
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          lVar26 = (long)(int)uVar1 * 4;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < iVar2) {
              lVar25 = 0;
              pvVar17 = pvVar15;
              pvVar23 = pvVar16;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar21 + lVar25 * 4 + uVar22 * lVar19 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar17 + uVar24 * 4) =
                         fVar28 / *(float *)((long)pvVar23 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar1 != uVar24);
                }
                lVar25 = lVar25 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar26);
                pvVar23 = (void *)((long)pvVar23 + lVar26);
              } while (lVar25 != lVar19);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              fVar28 = *(float *)((long)pvVar21 + uVar22 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     fVar28 / *(float *)((long)pvVar16 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar3) {
        fVar28 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar22 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar24 = 0;
            do {
              *(float *)((long)pvVar15 + uVar24 * 4) =
                   fVar28 / *(float *)((long)pvVar16 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar14 != uVar24);
          }
          uVar22 = uVar22 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
        } while (uVar22 != uVar20);
        return 0;
      }
      return 0;
    }
    uVar18 = iVar4 * uVar3;
    if (uVar1 == 1) {
      iVar2 = pMVar7[1].dims;
      if (iVar2 == 1) {
        Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            pvVar16 = pMVar7[1].data;
            fVar28 = *pMVar7->data;
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   *(float *)((long)pvVar16 + uVar20 * 4) * (1.0 / fVar28);
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar18) {
            pvVar16 = pMVar7[1].data;
            fVar28 = *pMVar7->data;
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   *(float *)((long)pvVar16 + uVar20 * 4) * (1.0 / fVar28);
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 == 3) {
        Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar5) {
            pvVar16 = pMVar7[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].elemsize;
            fVar28 = *pMVar7->data;
            sVar11 = pMVar7[1].cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar16 + uVar24 * 4) * (1.0 / fVar28);
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar16 = (void *)((long)pvVar16 + sVar10 * sVar11);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    iVar2 = pMVar7[1].dims;
    if (iVar2 != 1) {
      if (iVar2 == 2) {
        Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar4) {
            pvVar16 = pMVar7->data;
            pvVar21 = pMVar7[1].data;
            lVar19 = (long)(int)uVar3 * 4;
            lVar25 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar20 * 4) =
                       *(float *)((long)pvVar21 + uVar20 * 4) * (1.0 / fVar28);
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              lVar25 = lVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar19);
              pvVar21 = (void *)((long)pvVar21 + lVar19);
            } while (lVar25 != lVar26);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar2 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (0 < (int)uVar5) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar22 = 0;
        do {
          if (0 < (int)uVar18) {
            fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
            uVar24 = 0;
            do {
              *(float *)((long)pvVar15 + uVar24 * 4) =
                   *(float *)((long)pvVar21 + uVar24 * 4) * (1.0 / fVar28);
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
          }
          uVar22 = uVar22 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar22 != uVar20);
        return 0;
      }
      return 0;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar20 = 0;
        do {
          *(float *)((long)pvVar15 + uVar20 * 4) =
               *(float *)((long)pvVar21 + uVar20 * 4) / *(float *)((long)pvVar16 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar14) {
      fVar28 = *pMVar7[1].data;
      pvVar16 = pMVar7->data;
      uVar20 = 0;
      do {
        *(float *)((long)pvVar15 + uVar20 * 4) = fVar28 / *(float *)((long)pvVar16 + uVar20 * 4);
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
      return 0;
    }
    return 0;
  }
  uVar1 = pMVar7->w;
  iVar2 = pMVar7->h;
  lVar19 = (long)iVar2;
  uVar14 = iVar2 * uVar1;
  sVar8 = pMVar7->elemsize;
  uVar3 = pMVar7[1].w;
  iVar4 = pMVar7[1].h;
  lVar26 = (long)iVar4;
  uVar5 = pMVar7[1].c;
  uVar20 = (ulong)uVar5;
  iVar6 = pMVar7->dims;
  if (iVar6 != 1) {
    if (iVar6 != 2) {
      if (iVar6 != 3) {
        return 0;
      }
      uVar3 = pMVar7->c;
      uVar20 = (ulong)uVar3;
      Mat::create(this_00,uVar1,iVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar4 = pMVar7[1].dims;
      if (iVar4 != 1) {
        if (iVar4 == 3) {
          if (0 < (int)uVar3) {
            pvVar16 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar21 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar22 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar16 + uVar24 * 4) -
                       *(float *)((long)pvVar21 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar14 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar13);
            } while (uVar22 != uVar20);
            return 0;
          }
          return 0;
        }
        if (iVar4 != 2) {
          return 0;
        }
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          lVar26 = (long)(int)uVar1 * 4;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < iVar2) {
              lVar25 = 0;
              pvVar17 = pvVar16;
              pvVar23 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar21 + lVar25 * 4 + uVar22 * lVar19 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar23 + uVar24 * 4) =
                         *(float *)((long)pvVar17 + uVar24 * 4) - fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar1 != uVar24);
                }
                lVar25 = lVar25 + 1;
                pvVar23 = (void *)((long)pvVar23 + lVar26);
                pvVar17 = (void *)((long)pvVar17 + lVar26);
              } while (lVar25 != lVar19);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar3) {
          pvVar16 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar14) {
              fVar28 = *(float *)((long)pvVar21 + uVar22 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     *(float *)((long)pvVar16 + uVar24 * 4) - fVar28;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar3) {
        fVar28 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar22 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar24 = 0;
            do {
              *(float *)((long)pvVar15 + uVar24 * 4) =
                   *(float *)((long)pvVar16 + uVar24 * 4) - fVar28;
              uVar24 = uVar24 + 1;
            } while (uVar14 != uVar24);
          }
          uVar22 = uVar22 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
        } while (uVar22 != uVar20);
        return 0;
      }
      return 0;
    }
    if (pMVar7[1].dims == 3) {
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 != 0) {
        if (0 < (int)uVar5) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          lVar19 = (long)(int)uVar3 * 4;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < iVar4) {
              lVar25 = 0;
              pvVar17 = pvVar15;
              pvVar23 = pvVar21;
              do {
                if (0 < (int)uVar3) {
                  fVar28 = *(float *)((long)pvVar16 + lVar25 * 4 + uVar22 * lVar26 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar17 + uVar24 * 4) =
                         fVar28 - *(float *)((long)pvVar23 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar3 != uVar24);
                }
                lVar25 = lVar25 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar19);
                pvVar23 = (void *)((long)pvVar23 + lVar19);
              } while (lVar25 != lVar26);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].dims != 1) {
      if (pMVar7[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar20 = 0;
        do {
          *(float *)((long)pvVar15 + uVar20 * 4) =
               *(float *)((long)pvVar16 + uVar20 * 4) - *(float *)((long)pvVar21 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    Mat::create(this_00,uVar1,iVar2,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (pMVar7[1].w != 1) {
        if (0 < iVar2) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar26 = (long)(int)uVar1 * 4;
          lVar25 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + lVar25 * 4);
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     *(float *)((long)pvVar16 + uVar20 * 4) - fVar28;
                uVar20 = uVar20 + 1;
              } while (uVar1 != uVar20);
            }
            lVar25 = lVar25 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar26);
            pvVar16 = (void *)((long)pvVar16 + lVar26);
          } while (lVar25 != lVar19);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar14) {
        fVar28 = *pMVar7[1].data;
        pvVar16 = pMVar7->data;
        uVar20 = 0;
        do {
          *(float *)((long)pvVar15 + uVar20 * 4) = *(float *)((long)pvVar16 + uVar20 * 4) - fVar28;
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  uVar18 = iVar4 * uVar3;
  if (uVar1 == 1) {
    iVar2 = pMVar7[1].dims;
    if (iVar2 == 1) {
      Mat::create(this_00,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar18) {
          fVar28 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar28 - *(float *)((long)pvVar16 + uVar20 * 4)
            ;
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar2 == 2) {
      Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar18) {
          fVar28 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar28 - *(float *)((long)pvVar16 + uVar20 * 4)
            ;
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar2 == 3) {
      Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 != 0) {
        if (0 < (int)uVar5) {
          fVar28 = *pMVar7->data;
          pvVar16 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar22 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     fVar28 - *(float *)((long)pvVar16 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar22 = uVar22 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar11);
          } while (uVar22 != uVar20);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  iVar2 = pMVar7[1].dims;
  if (iVar2 != 1) {
    if (iVar2 == 2) {
      Mat::create(this_00,uVar3,iVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < iVar4) {
          pvVar16 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar19 = (long)(int)uVar3 * 4;
          lVar25 = 0;
          do {
            if (0 < (int)uVar3) {
              fVar28 = *(float *)((long)pvVar16 + lVar25 * 4);
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     fVar28 - *(float *)((long)pvVar21 + uVar20 * 4);
                uVar20 = uVar20 + 1;
              } while (uVar3 != uVar20);
            }
            lVar25 = lVar25 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar19);
            pvVar21 = (void *)((long)pvVar21 + lVar19);
          } while (lVar25 != lVar26);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar2 != 3) {
      return 0;
    }
    Mat::create(this_00,uVar3,iVar4,uVar5,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 != (void *)0x0) {
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (0 < (int)uVar5) {
        pvVar16 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar22 = 0;
        do {
          if (0 < (int)uVar18) {
            fVar28 = *(float *)((long)pvVar16 + uVar22 * 4);
            uVar24 = 0;
            do {
              *(float *)((long)pvVar15 + uVar24 * 4) =
                   fVar28 - *(float *)((long)pvVar21 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
          }
          uVar22 = uVar22 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar22 != uVar20);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
  pvVar15 = this_00->data;
  if (pvVar15 == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (pMVar7[1].w != 1) {
    if (0 < (int)uVar14) {
      pvVar16 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      uVar20 = 0;
      do {
        *(float *)((long)pvVar15 + uVar20 * 4) =
             *(float *)((long)pvVar16 + uVar20 * 4) - *(float *)((long)pvVar21 + uVar20 * 4);
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
      return 0;
    }
    return 0;
  }
  if (0 < (int)uVar14) {
    fVar28 = *pMVar7[1].data;
    pvVar16 = pMVar7->data;
    uVar20 = 0;
    do {
      *(float *)((long)pvVar15 + uVar20 * 4) = *(float *)((long)pvVar16 + uVar20 * 4) - fVar28;
      uVar20 = uVar20 + 1;
    } while (uVar14 != uVar20);
    return 0;
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op< std::plus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op< std::minus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op< std::multiplies<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op< std::divides<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op< binary_op_max<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op< binary_op_min<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op< binary_op_pow<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op< binary_op_rsub<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op< binary_op_rdiv<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}